

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  _List_node_base *num;
  typed_address<char> tVar1;
  element_type *peVar2;
  uint64_t num_00;
  size_t sVar3;
  ostream *poVar4;
  undefined1 auVar5 [4];
  undefined1 auVar6 [4];
  int __fd;
  transaction<pstore::lock_guard<pstore::transaction_mutex>_> *transaction_00;
  _List_node_base *p_Var7;
  undefined1 local_5cc [4];
  typed_address<char> addr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_5c0 [2];
  int local_5ac;
  ostream *local_5a8;
  not_null<const_pstore::sstring_view<const_char_*>_*> local_5a0;
  extent<char> local_598;
  typed_address<char> addr_1;
  span<char,__1L> span;
  shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  write;
  indirect_string_adder adder;
  int local_530;
  shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
  name;
  string local_518;
  switches opt;
  transaction<pstore::lock_guard<pstore::transaction_mutex>_> transaction;
  database database;
  vector<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  strings;
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
  local_230 [2];
  pair<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>,_bool>
  local_220;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  local_128;
  
  local_5cc = (undefined1  [4])0x0;
  opt.db_path._M_dataplus._M_p = (pointer)&opt.db_path.field_2;
  opt.db_path._M_string_length = 0;
  opt.db_path.field_2._M_local_buf[0] = '\0';
  opt.vmode = disabled;
  opt.add.
  super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&opt.add;
  opt.add.
  super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl._M_node._M_size = 0;
  opt.strings.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&opt.strings;
  opt.strings.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  opt.files.
  super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&opt.files;
  opt.files.
  super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl._M_node._M_size = 0;
  opt.add.
  super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       opt.add.
       super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  opt.strings.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       opt.strings.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  opt.files.
  super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       opt.files.
       super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  get_switches((pair<switches,_int> *)&database,argc,argv);
  strings.
  super__Vector_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_5cc;
  strings.
  super__Vector_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&opt;
  std::tuple<switches&,int&>::operator=
            ((tuple<switches&,int&> *)&strings,(pair<switches,_int> *)&database);
  switches::~switches((switches *)&database);
  auVar6 = local_5cc;
  auVar5 = local_5cc;
  if (local_5cc == (undefined1  [4])0x0) {
    pstore::database::database(&database,&opt.db_path,writable,true);
    database.vacuum_mode_ = opt.vmode;
    pstore::begin(&transaction,&database);
    pstore::index::
    get_index<(pstore::trailer::indices)3,pstore::database,pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>>
              ((index *)&name,&database,true);
    local_5ac = (int)auVar6;
    pstore::index::
    get_index<(pstore::trailer::indices)5,pstore::database,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
              ((index *)&write,&database,true);
    for (p_Var7 = opt.add.
                  super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        peVar2 = write.
                 super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr, p_Var7 != (_List_node_base *)&opt.add; p_Var7 = p_Var7->_M_next) {
      num = p_Var7[3]._M_prev;
      addr.a_.a_ = (address)0;
      adder.views_.
      super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      adder.views_.
      super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pstore::transaction_base::alloc_rw<char,void>
                ((pair<std::shared_ptr<char>,_pstore::typed_address<char>_> *)&strings,
                 &transaction.super_transaction_base,(size_t)num);
      local_518._M_dataplus._M_p = (pointer)&addr;
      local_518._M_string_length = (size_type)&adder;
      std::tuple<std::shared_ptr<char>&,pstore::typed_address<char>&>::operator=
                ((tuple<std::shared_ptr<char>&,pstore::typed_address<char>&> *)&local_518,
                 (pair<std::shared_ptr<char>,_pstore::typed_address<char>_> *)&strings);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &strings.
                  super__Vector_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      if (p_Var7[3]._M_prev != (_List_node_base *)0x0) {
        memmove(adder.views_.
                super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start,p_Var7[3]._M_next,
                (size_t)p_Var7[3]._M_prev);
      }
      tVar1.a_.a_ = addr.a_.a_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &adder.views_.
                  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      span.storage_.data_ = (pointer)num;
      span.storage_.super_extent_type<_1L>.size_ = (index_type)tVar1.a_.a_;
      pstore::index::
      hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
      ::insert_or_assign<std::__cxx11::string,pstore::extent<char>,void>
                (&local_128,
                 (hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
                  *)peVar2,&transaction.super_transaction_base,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var7 + 1),
                 (extent<char> *)&span);
      std::
      unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
      ::~unique_ptr(&local_128.first.pos_);
    }
    local_5a8 = (ostream *)&std::cerr;
    for (p_Var7 = opt.files.
                  super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        peVar2 = write.
                 super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr, p_Var7 != (_List_node_base *)&opt.files; p_Var7 = p_Var7->_M_next) {
      std::__cxx11::string::string((string *)&local_518,(string *)(p_Var7 + 3));
      pstore::file::file_handle::file_handle((file_handle *)&adder,&local_518);
      std::__cxx11::string::~string((string *)&local_518);
      pstore::file::file_handle::open((file_handle *)&adder,(char *)0x1,0,0);
      if (local_530 == -1) {
        pstore::file::file_handle::~file_handle((file_handle *)&adder);
        poVar4 = std::operator<<(local_5a8,(string *)(p_Var7 + 3));
        std::operator<<(poVar4,": No such file or directory\n");
        local_5cc = (undefined1  [4])0x1;
      }
      else {
        num_00 = pstore::file::file_handle::size((file_handle *)&adder);
        addr_1.a_.a_ = (address)0;
        addr.a_.a_ = (address)0;
        a_Stack_5c0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pstore::transaction_base::alloc_rw<char,void>
                  ((pair<std::shared_ptr<char>,_pstore::typed_address<char>_> *)&span,
                   &transaction.super_transaction_base,num_00);
        local_598.addr.a_.a_ = (address)&addr_1;
        local_598.size = (uint64_t)&addr;
        std::tuple<std::shared_ptr<char>&,pstore::typed_address<char>&>::operator=
                  ((tuple<std::shared_ptr<char>&,pstore::typed_address<char>&> *)&local_598,
                   (pair<std::shared_ptr<char>,_pstore::typed_address<char>_> *)&span);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&span.storage_.data_);
        span = pstore::gsl::make_span<char>((char *)addr.a_.a_,num_00);
        sVar3 = pstore::file::file_base::read_span<pstore::gsl::span<char,_1l>,void>
                          ((file_base *)&adder,&span);
        if (span.storage_.super_extent_type<_1L>.size_ < 0) {
          pstore::assert_failed
                    ("expected_size >= 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/write/main.cpp"
                     ,0x43);
        }
        if (sVar3 != span.storage_.super_extent_type<_1L>.size_) {
          std::operator<<(local_5a8,"Did not read the number of bytes requested");
          exit(1);
        }
        local_598.addr = (typed_address<char>)(typed_address<char>)addr_1.a_.a_;
        local_598.size = num_00;
        pstore::index::
        hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
        ::insert_or_assign<std::__cxx11::string,pstore::extent<char>,void>
                  ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
                    *)&strings,
                   (hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
                    *)peVar2,&transaction.super_transaction_base,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var7 + 1)
                   ,&local_598);
        std::
        unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
        ::~unique_ptr(local_230);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_5c0);
        pstore::file::file_handle::~file_handle((file_handle *)&adder);
      }
    }
    strings.
    super__Vector_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    strings.
    super__Vector_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    strings.
    super__Vector_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
    ::reserve(&strings,opt.strings.
                       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl._M_node._M_size);
    adder.views_.
    super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    adder.views_.
    super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    adder.views_.
    super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (p_Var7 = opt.strings.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        p_Var7 != (_List_node_base *)&opt.strings; p_Var7 = p_Var7->_M_next) {
      local_518._M_dataplus._M_p = (pointer)p_Var7[1]._M_next;
      local_518._M_string_length = (size_type)p_Var7[1]._M_prev;
      std::
      vector<pstore::sstring_view<char_const*>,std::allocator<pstore::sstring_view<char_const*>>>::
      emplace_back<pstore::sstring_view<char_const*>>
                ((vector<pstore::sstring_view<char_const*>,std::allocator<pstore::sstring_view<char_const*>>>
                  *)&strings,(sstring_view<const_char_*> *)&local_518);
      local_5a0.ptr_ =
           strings.
           super__Vector_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
      pstore::gsl::not_null<const_pstore::sstring_view<const_char_*>_*>::ensure_invariant
                (&local_5a0);
      pstore::indirect_string_adder::
      add<pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>>
                (&local_220,&adder,&transaction.super_transaction_base,&name,local_5a0);
      std::
      unique_ptr<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
      ::~unique_ptr(&local_220.first.it_.pos_);
    }
    transaction_00 = &transaction;
    pstore::indirect_string_adder::flush(&adder,&transaction_00->super_transaction_base);
    __fd = (int)transaction_00;
    pstore::transaction_base::commit(&transaction.super_transaction_base);
    std::
    _Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
    ::~_Vector_base((_Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
                     *)&adder);
    std::
    _Vector_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
    ::~_Vector_base(&strings.
                     super__Vector_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
                   );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&write.
                super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&name.
                super___shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>_>::~transaction(&transaction);
    pstore::database::close(&database,__fd);
    auVar6 = (undefined1  [4])local_5ac;
    pstore::database::~database(&database);
    auVar5 = (undefined1  [4])0x0;
  }
  switches::~switches(&opt);
  if (auVar6 == (undefined1  [4])0x0) {
    auVar5 = local_5cc;
  }
  return (int)auVar5;
}

Assistant:

int main (int argc, char * argv[]) {
#endif
    int exit_code = EXIT_SUCCESS;

    using pstore::utf::to_native_string;

    PSTORE_TRY {
        switches opt;
        std::tie (opt, exit_code) = get_switches (argc, argv);
        if (exit_code != EXIT_SUCCESS) {
            return exit_code;
        }

        pstore::database database (opt.db_path, pstore::database::access_mode::writable);
        database.set_vacuum_mode (opt.vmode);

        {
            // Start a transaction...
            auto transaction = pstore::begin (database);

            // Read the write and name indexes.
            std::shared_ptr<pstore::index::name_index> const name =
                pstore::index::get_index<pstore::trailer::indices::name> (database);
            std::shared_ptr<pstore::index::write_index> const write =
                pstore::index::get_index<pstore::trailer::indices::write> (database);

            // Scan through the string value arguments from the command line. These are of
            // the form key,value where value is a string which is stored directly.
            for (std::pair<std::string, std::string> const & v : opt.add) {
                write->insert_or_assign (transaction, v.first,
                                         append_string (transaction, v.second));
            }

            // Now record the files requested on the command line.
            for (std::pair<std::string, std::string> const & v : opt.files) {
                if (!add_file (transaction, *write, v.first, v.second)) {
                    error_stream << to_native_string (v.second)
                                 << PSTORE_NATIVE_TEXT (": No such file or directory\n");
                    exit_code = EXIT_FAILURE;
                }
            }

            // Scan through the string arguments from the command line.
            std::vector<pstore::raw_sstring_view> strings;
            strings.reserve (opt.strings.size ());
            pstore::indirect_string_adder adder;
            for (std::string const & str : opt.strings) {
                strings.emplace_back (pstore::make_sstring_view (str));
                auto & s = strings.back ();
                adder.add (transaction, name, &s);
            }
            adder.flush (transaction);

            transaction.commit ();
        }

        database.close ();
    }